

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.hh
# Opt level: O0

void __thiscall
tinyusdz::ascii::AsciiParser::VariableDef::VariableDef(VariableDef *this,VariableDef *rhs)

{
  VariableDef *rhs_local;
  VariableDef *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)rhs);
  ::std::__cxx11::string::string((string *)&this->name,(string *)&rhs->name);
  this->allow_array_type = (bool)(rhs->allow_array_type & 1);
  ::std::
  function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->post_parse_handler,&rhs->post_parse_handler);
  return;
}

Assistant:

VariableDef(const VariableDef &rhs) = default;